

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int local_84;
  int local_80;
  wchar_t actual_failure;
  wchar_t expected_failure;
  char c;
  char **actual;
  char *p;
  char **expected;
  size_t j;
  size_t i;
  size_t actual_count;
  size_t expected_count;
  size_t buff_size;
  char *buff;
  char **lines_local;
  char *pathname_local;
  char *pcStack_18;
  wchar_t line_local;
  char *file_local;
  
  p = (char *)0x0;
  _expected_failure = (void *)0x0;
  local_80 = 0;
  local_84 = 0;
  buff = (char *)lines;
  lines_local = (char **)pathname;
  pathname_local._4_4_ = line;
  pcStack_18 = file;
  assertion_count(file,line);
  buff_size = (size_t)slurpfile(&expected_count,"%s",lines_local);
  if ((char *)buff_size == (char *)0x0) {
    failure_start((char *)lines_local,pathname_local._4_4_,"Can\'t read file: %s",lines_local);
    failure_finish((void *)0x0);
    return L'\0';
  }
  for (j = 0; sVar1 = j, *(long *)(buff + j * 8) != 0; j = j + 1) {
  }
  if (j != 0) {
    p = (char *)calloc(j,8);
    if (p == (char *)0x0) {
      failure_start((char *)lines_local,pathname_local._4_4_,"Can\'t allocate memory");
      failure_finish((void *)0x0);
      goto LAB_001051ac;
    }
    for (j = 0; *(long *)(buff + j * 8) != 0; j = j + 1) {
      pcVar3 = strdup(*(char **)(buff + j * 8));
      *(char **)(p + j * 8) = pcVar3;
      if (*(long *)(p + j * 8) == 0) {
        failure_start((char *)lines_local,pathname_local._4_4_,"Can\'t allocate memory");
        failure_finish((void *)0x0);
        goto LAB_001051ac;
      }
    }
  }
  i = 0;
  actual_failure._3_1_ = '\0';
  for (actual = (char **)buff_size; actual < (char **)(buff_size + expected_count);
      actual = (char **)((long)actual + 1)) {
    if ((*(char *)actual == '\r') || (*(char *)actual == '\n')) {
      *(undefined1 *)actual = 0;
    }
    if ((actual_failure._3_1_ == '\0') && (*(char *)actual != '\0')) {
      i = i + 1;
    }
    actual_failure._3_1_ = *(char *)actual;
  }
  if (i != 0) {
    _expected_failure = calloc(i,8);
    if (_expected_failure == (void *)0x0) {
      failure_start((char *)lines_local,pathname_local._4_4_,"Can\'t allocate memory");
      failure_finish((void *)0x0);
      goto LAB_001051ac;
    }
    expected = (char **)0x0;
    for (actual = (char **)buff_size; actual < (char **)(buff_size + expected_count);
        actual = (char **)(sVar4 + 1 + (long)actual)) {
      if (*(char *)actual != '\0') {
        *(char ***)((long)_expected_failure + (long)expected * 8) = actual;
        expected = (char **)((long)expected + 1);
      }
      sVar4 = strlen((char *)actual);
    }
  }
  for (j = 0; j < sVar1; j = j + 1) {
    for (expected = (char **)0x0; expected < i; expected = (char **)((long)expected + 1)) {
      if ((*(long *)((long)_expected_failure + (long)expected * 8) != 0) &&
         (iVar2 = strcmp(*(char **)(p + j * 8),
                         *(char **)((long)_expected_failure + (long)expected * 8)), iVar2 == 0)) {
        free(*(void **)(p + j * 8));
        pcVar3 = p + j * 8;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)((long)_expected_failure + (long)expected * 8) = 0;
        break;
      }
    }
  }
  for (j = 0; j < sVar1; j = j + 1) {
    if (*(long *)(p + j * 8) != 0) {
      local_80 = local_80 + 1;
    }
  }
  for (expected = (char **)0x0; expected < i; expected = (char **)((long)expected + 1)) {
    if (*(long *)((long)_expected_failure + (long)expected * 8) != 0) {
      local_84 = local_84 + 1;
    }
  }
  if ((local_80 == 0) && (local_84 == 0)) {
    free(_expected_failure);
    free(p);
    free((void *)buff_size);
    return L'\x01';
  }
  failure_start(pcStack_18,pathname_local._4_4_,"File doesn\'t match: %s",lines_local);
  for (j = 0; j < sVar1; j = j + 1) {
    if (*(long *)(p + j * 8) != 0) {
      logprintf("  Expected but not present: %s\n",*(undefined8 *)(p + j * 8));
      free(*(void **)(p + j * 8));
      pcVar3 = p + j * 8;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
  }
  for (expected = (char **)0x0; expected < i; expected = (char **)((long)expected + 1)) {
    if (*(long *)((long)_expected_failure + (long)expected * 8) != 0) {
      logprintf("  Present but not expected: %s\n",
                *(undefined8 *)((long)_expected_failure + (long)expected * 8));
    }
  }
  failure_finish((void *)0x0);
LAB_001051ac:
  free(_expected_failure);
  if (p != (char *)0x0) {
    for (j = 0; j < sVar1; j = j + 1) {
      if (*(long *)(p + j * 8) != 0) {
        free(*(void **)(p + j * 8));
      }
    }
    free(p);
  }
  free((void *)buff_size);
  return L'\0';
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = calloc(expected_count, sizeof(*expected));
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			goto cleanup;
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
			if (expected[i] == NULL) {
				failure_start(pathname, line, "Can't allocate memory");
				failure_finish(NULL);
				goto cleanup;
			}
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(actual_count, sizeof(char *));
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			goto cleanup;
		}
		for (j = 0, p = buff; p < buff + buff_size;
		    p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(actual);
		free(expected);
		free(buff);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
			expected[i] = NULL;
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
cleanup:
	free(actual);
	if (expected != NULL) {
		for (i = 0; i < expected_count; ++i)
			if (expected[i] != NULL)
				free(expected[i]);
		free(expected);
	}
	free(buff);
	return (0);
}